

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

void token_copy(token_t *from,token_t *to)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  uVar1 = from->line;
  uVar2 = from->column;
  uVar3 = from->constant;
  to->id = from->id;
  to->line = uVar1;
  to->column = uVar2;
  to->constant = uVar3;
  iVar4 = from->_word;
  to->_unsigned = from->_unsigned;
  to->_word = iVar4;
  strcpy(to->string,from->string);
  return;
}

Assistant:

void token_copy(token_t* from, token_t* to)
{
    to->id = from->id;
    to->line = from->line;
    to->column = from->column;
    to->constant = from->constant;
    to->_unsigned = from->_unsigned;
    to->_word = from->_word;
    strcpy(to->string, from->string);
}